

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

void __thiscall
pstore::index::
hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::iterator_base<true>::move_to_left_most_child(iterator_base<true> *this,index_pointer node)

{
  bool bVar1;
  size_type sVar2;
  internal_node *piVar3;
  index_pointer *piVar4;
  parent_type local_d8;
  address local_c8;
  shared_ptr<const_void> local_c0;
  iterator_base<true> *local_b0;
  pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
  local_a8;
  linear_node *local_90;
  linear_node *linear;
  iterator_base<true> *local_78;
  pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
  local_70;
  internal_node *local_58;
  internal_node *internal;
  iterator_base<true> *local_40;
  parent_type local_38;
  undefined1 local_28 [8];
  shared_ptr<const_void> store_node;
  iterator_base<true> *this_local;
  index_pointer node_local;
  
  store_node.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  this_local = (iterator_base<true> *)node;
  std::shared_ptr<const_void>::shared_ptr((shared_ptr<const_void> *)local_28);
  while( true ) {
    while( true ) {
      bVar1 = details::index_pointer::is_leaf((index_pointer *)&this_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        details::parent_type::parent_type(&local_d8,(index_pointer)this_local,0xffffffffffffffff);
        array_stack<pstore::index::details::parent_type,_13UL>::push
                  (&this->visited_parents_,&local_d8);
        std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)local_28);
        return;
      }
      local_40 = this_local;
      details::parent_type::parent_type(&local_38,(index_pointer)this_local,0);
      array_stack<pstore::index::details::parent_type,_13UL>::push
                (&this->visited_parents_,&local_38);
      sVar2 = array_stack<pstore::index::details::parent_type,_13UL>::size(&this->visited_parents_);
      if (sVar2 < 0xc) break;
      local_90 = (linear_node *)0x0;
      local_b0 = this_local;
      details::linear_node::get_node(&local_a8,this->db_,(index_pointer)this_local);
      std::tie<std::shared_ptr<void_const>,pstore::index::details::linear_node_const*>
                (&local_c0,(linear_node **)local_28);
      std::tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&>::
      operator=((tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&> *)
                &local_c0,&local_a8);
      std::
      pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
      ::~pair(&local_a8);
      local_c8 = details::linear_node::operator[](local_90,0);
      details::index_pointer::operator=((index_pointer *)&this_local,&local_c8);
    }
    local_58 = (internal_node *)0x0;
    local_78 = this_local;
    details::internal_node::get_node(&local_70,this->db_,(index_pointer)this_local);
    std::tie<std::shared_ptr<void_const>,pstore::index::details::internal_node_const*>
              ((shared_ptr<const_void> *)&linear,(internal_node **)local_28);
    std::tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&>::
    operator=((tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&> *)
              &linear,&local_70);
    std::
    pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
    ::~pair(&local_70);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
    if ((bVar1) &&
       (piVar3 = (internal_node *)
                 std::__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2> *)local_28),
       piVar3 != local_58)) break;
    piVar4 = details::internal_node::operator[](local_58,0);
    this_local = (iterator_base<true> *)piVar4->internal_;
  }
  assert_failed("!store_node || store_node.get () == internal",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                ,0x262);
}

Assistant:

void hamt_map<KeyType, ValueType, Hash, KeyEqual>::iterator_base<
            IsConstIterator>::move_to_left_most_child (index_pointer node) {

            std::shared_ptr<void const> store_node;
            while (!node.is_leaf ()) {
                visited_parents_.push (details::parent_type{node, 0});
                if (visited_parents_.size () <= details::max_internal_depth) {
                    internal_node const * internal = nullptr;
                    std::tie (store_node, internal) = internal_node::get_node (db_, node);
                    PSTORE_ASSERT (!store_node || store_node.get () == internal);
                    node = (*internal)[0];
                } else {
                    linear_node const * linear = nullptr;
                    std::tie (store_node, linear) = linear_node::get_node (db_, node);
                    node = (*linear)[0];
                }
            }

            // Push the leaf on the stack.
            visited_parents_.push (details::parent_type{node});
        }